

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

void __thiscall absl::lts_20250127::cord_internal::CordzInfo::Untrack(CordzInfo *this)

{
  bool bVar1;
  __pointer_type pCVar2;
  MutexLock local_50;
  MutexLock lock;
  anon_class_1_0_00000001 local_31;
  __pointer_type local_30;
  CordzInfo *prev;
  CordzInfo *next;
  CordzInfo *head;
  SpinLockHolder l;
  CordzInfo *this_local;
  
  l.lock_ = (SpinLock *)this;
  ODRCheck(this);
  base_internal::SpinLockHolder::SpinLockHolder((SpinLockHolder *)&head,&this->list_->mutex);
  next = std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::load
                   (&this->list_->head,memory_order_acquire);
  prev = std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::load
                   (&this->ci_next_,memory_order_acquire);
  local_30 = std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::load
                       (&this->ci_prev_,memory_order_acquire);
  if (prev != (CordzInfo *)0x0) {
    pCVar2 = std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::load
                       (&prev->ci_prev_,memory_order_acquire);
    if (pCVar2 != this) {
      Untrack::anon_class_1_0_00000001::operator()(&local_31);
    }
    std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::store
              (&prev->ci_prev_,local_30,memory_order_release);
  }
  if (local_30 == (__pointer_type)0x0) {
    if (next != this) {
      Untrack::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)((long)&lock.mu_ + 1))
      ;
    }
    std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::store
              (&this->list_->head,prev,memory_order_release);
  }
  else {
    if (next == this) {
      Untrack::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)((long)&lock.mu_ + 3))
      ;
    }
    pCVar2 = std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::load
                       (&local_30->ci_next_,memory_order_acquire);
    if (pCVar2 != this) {
      Untrack::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)((long)&lock.mu_ + 2))
      ;
    }
    std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::store
              (&local_30->ci_next_,prev,memory_order_release);
  }
  base_internal::SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&head);
  bVar1 = CordzHandle::SafeToDelete(&this->super_CordzHandle);
  if (bVar1) {
    UnsafeSetCordRep(this,(CordRep *)0x0);
    if (this != (CordzInfo *)0x0) {
      (*(this->super_CordzHandle)._vptr_CordzHandle[1])();
    }
  }
  else {
    MutexLock::MutexLock(&local_50,&this->mutex_);
    if (this->rep_ != (CordRep *)0x0) {
      CordRep::Ref(this->rep_);
    }
    MutexLock::~MutexLock(&local_50);
    CordzHandle::Delete(&this->super_CordzHandle);
  }
  return;
}

Assistant:

void CordzInfo::Untrack() {
  ODRCheck();
  {
    SpinLockHolder l(&list_->mutex);

    CordzInfo* const head = list_->head.load(std::memory_order_acquire);
    CordzInfo* const next = ci_next_.load(std::memory_order_acquire);
    CordzInfo* const prev = ci_prev_.load(std::memory_order_acquire);

    if (next) {
      ABSL_ASSERT(next->ci_prev_.load(std::memory_order_acquire) == this);
      next->ci_prev_.store(prev, std::memory_order_release);
    }
    if (prev) {
      ABSL_ASSERT(head != this);
      ABSL_ASSERT(prev->ci_next_.load(std::memory_order_acquire) == this);
      prev->ci_next_.store(next, std::memory_order_release);
    } else {
      ABSL_ASSERT(head == this);
      list_->head.store(next, std::memory_order_release);
    }
  }

  // We can no longer be discovered: perform a fast path check if we are not
  // listed on any delete queue, so we can directly delete this instance.
  if (SafeToDelete()) {
    UnsafeSetCordRep(nullptr);
    delete this;
    return;
  }

  // We are likely part of a snapshot, extend the life of the CordRep
  {
    absl::MutexLock lock(&mutex_);
    if (rep_) CordRep::Ref(rep_);
  }
  CordzHandle::Delete(this);
}